

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  ushort uVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  U32 tableSize;
  long lVar8;
  ulong uVar9;
  
  uVar1 = (ushort)*ctable;
  bVar2 = (byte)uVar1;
  lVar8 = 1;
  if (uVar1 != 0) {
    lVar8 = (long)(1 << (bVar2 - 1 & 0x1f));
  }
  sVar4 = 0xffffffffffffffff;
  if (max <= *(ushort *)((long)ctable + 2)) {
    uVar5 = 0;
    uVar9 = 0;
    do {
      iVar6 = (ctable[lVar8 + uVar5 * 2 + 2] >> 0x10) + 1;
      if ((ulong)count[uVar5] == 0) {
        bVar3 = false;
      }
      else {
        uVar7 = iVar6 * 0x100 -
                (iVar6 * 0x1000000 +
                 (ctable[lVar8 + uVar5 * 2 + 2] + (1 << (bVar2 & 0x1f))) * -0x100 >> (bVar2 & 0x1f))
        ;
        bVar3 = true;
        if (uVar7 < (uint)uVar1 * 0x100 + 0x100) {
          uVar9 = uVar9 + (ulong)uVar7 * (ulong)count[uVar5];
          bVar3 = false;
        }
      }
      if (bVar3) {
        return 0xffffffffffffffff;
      }
      uVar5 = uVar5 + 1;
    } while (max + 1 != uVar5);
    sVar4 = uVar9 >> 8;
  }
  return sVar4;
}

Assistant:

size_t ZSTD_fseBitCost(
    FSE_CTable const* ctable,
    unsigned const* count,
    unsigned const max)
{
    unsigned const kAccuracyLog = 8;
    size_t cost = 0;
    unsigned s;
    FSE_CState_t cstate;
    FSE_initCState(&cstate, ctable);
    if (ZSTD_getFSEMaxSymbolValue(ctable) < max) {
        DEBUGLOG(5, "Repeat FSE_CTable has maxSymbolValue %u < %u",
                    ZSTD_getFSEMaxSymbolValue(ctable), max);
        return ERROR(GENERIC);
    }
    for (s = 0; s <= max; ++s) {
        unsigned const tableLog = cstate.stateLog;
        unsigned const badCost = (tableLog + 1) << kAccuracyLog;
        unsigned const bitCost = FSE_bitCost(cstate.symbolTT, tableLog, s, kAccuracyLog);
        if (count[s] == 0)
            continue;
        if (bitCost >= badCost) {
            DEBUGLOG(5, "Repeat FSE_CTable has Prob[%u] == 0", s);
            return ERROR(GENERIC);
        }
        cost += (size_t)count[s] * bitCost;
    }
    return cost >> kAccuracyLog;
}